

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::createImageFormatTests
               (TestCaseGroup *testGroup,Function testFunction)

{
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  ImageFormatPropertyCase arg0_01;
  Function p_Var1;
  TestContext *pTVar2;
  TestNode *pTVar3;
  ImageFormatPropertyCase local_160;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  ImageFormatPropertyCase local_f8;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  ImageFormatPropertyCase local_90;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Function local_18;
  Function testFunction_local;
  TestCaseGroup *testGroup_local;
  
  local_18 = testFunction;
  testFunction_local = (Function)testGroup;
  pTVar2 = tcu::TestNode::getTestContext(&testGroup->super_TestNode);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"1d",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  ImageFormatPropertyCase::ImageFormatPropertyCase
            (&local_90,local_18,VK_FORMAT_UNDEFINED,VK_IMAGE_TYPE_1D,VK_IMAGE_TILING_LAST);
  arg0.format = local_90.format;
  arg0.imageType = local_90.imageType;
  arg0.testFunction = local_90.testFunction;
  arg0.tiling = local_90.tiling;
  arg0._20_4_ = local_90._20_4_;
  pTVar3 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar2,&local_38,&local_70,createImageFormatTypeTests,arg0)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  p_Var1 = testFunction_local;
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)testFunction_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"2d",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
  ImageFormatPropertyCase::ImageFormatPropertyCase
            (&local_f8,local_18,VK_FORMAT_UNDEFINED,VK_IMAGE_TYPE_2D,VK_IMAGE_TILING_LAST);
  arg0_00.format = local_f8.format;
  arg0_00.imageType = local_f8.imageType;
  arg0_00.testFunction = local_f8.testFunction;
  arg0_00.tiling = local_f8.tiling;
  arg0_00._20_4_ = local_f8._20_4_;
  pTVar3 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar2,&local_b0,&local_d8,createImageFormatTypeTests,arg0_00)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)p_Var1,pTVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  p_Var1 = testFunction_local;
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)testFunction_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"3d",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
  ImageFormatPropertyCase::ImageFormatPropertyCase
            (&local_160,local_18,VK_FORMAT_UNDEFINED,VK_IMAGE_TYPE_3D,VK_IMAGE_TILING_LAST);
  arg0_01.format = local_160.format;
  arg0_01.imageType = local_160.imageType;
  arg0_01.testFunction = local_160.testFunction;
  arg0_01.tiling = local_160.tiling;
  arg0_01._20_4_ = local_160._20_4_;
  pTVar3 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar2,&local_118,&local_140,createImageFormatTypeTests,arg0_01)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)p_Var1,pTVar3);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

void createImageFormatTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase::Function testFunction)
{
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "1d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_1D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "2d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "3d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_3D, VK_IMAGE_TILING_LAST)));
}